

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O3

void __thiscall
cs::compiler_type::preprocessor::process_endline
          (preprocessor *this,context_t *context,compiler_type *compiler,
          deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *tokens,charset *encoding)

{
  string *__rhs;
  iterator *piVar1;
  size_t sVar2;
  element_type *peVar3;
  pointer pcVar4;
  size_type sVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  exception *peVar10;
  long *plVar11;
  size_type *psVar12;
  size_type __n;
  _Elt_pointer pptVar13;
  char *size;
  deque<char,_std::allocator<char>_> *raw_buff;
  token_base *ptr;
  token_base *ptVar14;
  _Elt_pointer pptVar15;
  _Map_pointer ppptVar16;
  string version_str;
  string arg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  compiler_type *local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  charset *local_218;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190 [2];
  string local_150;
  string local_130 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (this->is_annotation == true) {
    this->is_annotation = false;
    new_empty_line(this,context);
    return;
  }
  if (this->is_command != true) goto LAB_002abf1f;
  this->is_command = false;
  __rhs = &this->command;
  iVar6 = std::__cxx11::string::compare((char *)__rhs);
  if ((iVar6 == 0) && (this->multi_line == false)) {
    this->multi_line = true;
  }
  else {
    size = "end";
    iVar6 = std::__cxx11::string::compare((char *)__rhs);
    if ((iVar6 == 0) && (this->multi_line == true)) {
      local_260._M_dataplus._M_p =
           (pointer)token_base::operator_new((token_base *)0x10,(size_t)size);
      ((token_base *)local_260._M_dataplus._M_p)->line_num = this->last_line_num;
      ((token_base *)local_260._M_dataplus._M_p)->_vptr_token_base =
           (_func_int **)&PTR__token_base_00332bc0;
      pptVar15 = (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                 _M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pptVar15 ==
          (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
          super__Deque_impl_data._M_finish._M_last + -1) {
        std::deque<cs::token_base*,std::allocator<cs::token_base*>>::
        _M_push_back_aux<cs::token_base*>
                  ((deque<cs::token_base*,std::allocator<cs::token_base*>> *)tokens,
                   (token_base **)&local_260);
      }
      else {
        *pptVar15 = (token_base *)local_260._M_dataplus._M_p;
        piVar1 = &(tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                  _M_impl.super__Deque_impl_data._M_finish;
        piVar1->_M_cur = piVar1->_M_cur + 1;
      }
      this->multi_line = false;
    }
    else {
      local_240 = compiler;
      lVar8 = std::__cxx11::string::find((char)__rhs,0x3a);
      local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
      local_260._M_string_length = 0;
      local_260.field_2._M_local_buf[0] = '\0';
      if (lVar8 != -1) {
        local_218 = encoding;
        std::__cxx11::string::substr((ulong)&local_280,(ulong)__rhs);
        std::__cxx11::string::operator=((string *)&local_260,(string *)&local_280);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._M_dataplus._M_p != &local_280.field_2) {
          operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::substr((ulong)&local_280,(ulong)__rhs);
        std::__cxx11::string::operator=((string *)__rhs,(string *)&local_280);
        encoding = local_218;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._M_dataplus._M_p != &local_280.field_2) {
          operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
        }
      }
      iVar6 = std::__cxx11::string::compare((char *)__rhs);
      if (iVar6 == 0) {
        iVar6 = std::__cxx11::string::compare((char *)&local_260);
        compiler = local_240;
        if (iVar6 == 0) {
          *encoding = ascii;
        }
        else {
          iVar6 = std::__cxx11::string::compare((char *)&local_260);
          if (iVar6 == 0) {
            *encoding = utf8;
          }
          else {
            iVar6 = std::__cxx11::string::compare((char *)&local_260);
            if (iVar6 != 0) {
              peVar10 = (exception *)__cxa_allocate_exception(0x90);
              sVar2 = this->line_num;
              peVar3 = (context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr;
              local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
              pcVar4 = (peVar3->file_path)._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_1b0,pcVar4,pcVar4 + (peVar3->file_path)._M_string_length);
              std::operator+(&local_238,"@",__rhs);
              plVar11 = (long *)std::__cxx11::string::append((char *)&local_238);
              local_280._M_dataplus._M_p = (pointer)*plVar11;
              psVar12 = (size_type *)(plVar11 + 2);
              if ((size_type *)local_280._M_dataplus._M_p == psVar12) {
                local_280.field_2._M_allocated_capacity = *psVar12;
                local_280.field_2._8_8_ = plVar11[3];
                local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
              }
              else {
                local_280.field_2._M_allocated_capacity = *psVar12;
              }
              local_280._M_string_length = plVar11[1];
              *plVar11 = (long)psVar12;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              std::operator+(&local_50,&local_280,&local_260);
              local_130[0]._M_dataplus._M_p = (pointer)&local_130[0].field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_130,"Unavailable encoding.","");
              exception::exception(peVar10,sVar2,&local_1b0,&local_50,local_130);
              __cxa_throw(peVar10,&exception::typeinfo,exception::~exception);
            }
            *encoding = gbk;
          }
        }
      }
      else {
        iVar6 = std::__cxx11::string::compare((char *)__rhs);
        if (iVar6 != 0) {
          peVar10 = (exception *)__cxa_allocate_exception(0x90);
          sVar2 = this->line_num;
          peVar3 = (context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
          local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
          pcVar4 = (peVar3->file_path)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1f0,pcVar4,pcVar4 + (peVar3->file_path)._M_string_length);
          std::operator+(&local_280,"@",__rhs);
          if (local_260._M_string_length == 0) {
            local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"");
          }
          else {
            std::operator+(&local_238,": ",&local_260);
          }
          std::operator+(&local_f0,&local_280,&local_238);
          local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_150,"Wrong grammar for preprocessor command.","");
          exception::exception(peVar10,sVar2,&local_1f0,&local_f0,&local_150);
          __cxa_throw(peVar10,&exception::typeinfo,exception::~exception);
        }
        local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"210508","");
        sVar5 = local_260._M_string_length;
        __n = local_260._M_string_length;
        if (local_280._M_string_length < local_260._M_string_length) {
          __n = local_280._M_string_length;
        }
        if (__n == 0) {
LAB_002abe21:
          uVar9 = 0xffffffff80000000;
          if (-0x80000000 < (long)(sVar5 - local_280._M_string_length)) {
            uVar9 = sVar5 - local_280._M_string_length;
          }
          if (0x7ffffffe < (long)uVar9) {
            uVar9 = 0x7fffffff;
          }
        }
        else {
          uVar7 = memcmp(local_260._M_dataplus._M_p,local_280._M_dataplus._M_p,__n);
          uVar9 = (ulong)uVar7;
          if (uVar7 == 0) goto LAB_002abe21;
        }
        compiler = local_240;
        if (0 < (int)uVar9) {
          peVar10 = (exception *)__cxa_allocate_exception(0x90);
          sVar2 = this->line_num;
          peVar3 = (context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
          local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
          pcVar4 = (peVar3->file_path)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1d0,pcVar4,pcVar4 + (peVar3->file_path)._M_string_length);
          std::operator+(&local_90,"@",__rhs);
          plVar11 = (long *)std::__cxx11::string::append((char *)&local_90);
          local_238._M_dataplus._M_p = (pointer)*plVar11;
          psVar12 = (size_type *)(plVar11 + 2);
          if ((size_type *)local_238._M_dataplus._M_p == psVar12) {
            local_238.field_2._M_allocated_capacity = *psVar12;
            local_238.field_2._8_8_ = plVar11[3];
            local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
          }
          else {
            local_238.field_2._M_allocated_capacity = *psVar12;
          }
          local_238._M_string_length = plVar11[1];
          *plVar11 = (long)psVar12;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          std::operator+(&local_70,&local_238,&local_260);
          std::operator+(&local_d0,"Newer Language Standard required: ",&local_260);
          plVar11 = (long *)std::__cxx11::string::append((char *)&local_d0);
          local_190[0]._M_dataplus._M_p = (pointer)*plVar11;
          psVar12 = (size_type *)(plVar11 + 2);
          if ((size_type *)local_190[0]._M_dataplus._M_p == psVar12) {
            local_190[0].field_2._0_8_ = *psVar12;
            local_190[0].field_2._8_8_ = plVar11[3];
            local_190[0]._M_dataplus._M_p = (pointer)&local_190[0].field_2;
          }
          else {
            local_190[0].field_2._0_8_ = *psVar12;
          }
          local_190[0]._M_string_length = plVar11[1];
          *plVar11 = (long)psVar12;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          std::operator+(&local_b0,local_190,&local_280);
          exception::exception(peVar10,sVar2,&local_1d0,&local_70,&local_b0);
          __cxa_throw(peVar10,&exception::typeinfo,exception::~exception);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._M_dataplus._M_p != &local_280.field_2) {
          operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != &local_260.field_2) {
        operator_delete(local_260._M_dataplus._M_p,
                        CONCAT71(local_260.field_2._M_allocated_capacity._1_7_,
                                 local_260.field_2._M_local_buf[0]) + 1);
      }
    }
  }
  (this->command)._M_string_length = 0;
  *(this->command)._M_dataplus._M_p = '\0';
LAB_002abf1f:
  if (this->empty_buff == true) {
    new_empty_line(this,context);
  }
  else {
    raw_buff = &this->buff;
    local_240 = (compiler_type *)raw_buff;
    process_char_buff(compiler,raw_buff,tokens,*encoding);
    pptVar15 = (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
               _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pptVar15 !=
        (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
        super__Deque_impl_data._M_start._M_cur) {
      pptVar13 = (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                 _M_impl.super__Deque_impl_data._M_finish._M_first;
      ppptVar16 = (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                  _M_impl.super__Deque_impl_data._M_finish._M_node;
      do {
        if (pptVar15 == pptVar13) {
          ptVar14 = ppptVar16[-1][0x3f];
          if (ptVar14 != (token_base *)0x0) goto LAB_002abf84;
LAB_002abfa1:
          pptVar13 = ppptVar16[-1];
          ppptVar16 = ppptVar16 + -1;
          pptVar15 = pptVar13 + 0x40;
        }
        else {
          ptVar14 = pptVar15[-1];
          if (ptVar14 != (token_base *)0x0) {
LAB_002abf84:
            iVar6 = (*ptVar14->_vptr_token_base[2])(ptVar14);
            if (iVar6 == 1) break;
            ptVar14->line_num = this->line_num;
            if (pptVar15 == pptVar13) goto LAB_002abfa1;
          }
        }
        pptVar15 = pptVar15 + -1;
      } while (pptVar15 !=
               (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
               _M_impl.super__Deque_impl_data._M_start._M_cur);
    }
    if (this->multi_line == false) {
      local_260._M_dataplus._M_p =
           (pointer)token_base::operator_new((token_base *)0x10,(size_t)raw_buff);
      ((token_base *)local_260._M_dataplus._M_p)->line_num = this->line_num;
      ((token_base *)local_260._M_dataplus._M_p)->_vptr_token_base =
           (_func_int **)&PTR__token_base_00332bc0;
      pptVar15 = (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                 _M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pptVar15 ==
          (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
          super__Deque_impl_data._M_finish._M_last + -1) {
        std::deque<cs::token_base*,std::allocator<cs::token_base*>>::
        _M_push_back_aux<cs::token_base*>
                  ((deque<cs::token_base*,std::allocator<cs::token_base*>> *)tokens,
                   (token_base **)&local_260);
      }
      else {
        *pptVar15 = (token_base *)local_260._M_dataplus._M_p;
        piVar1 = &(tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                  _M_impl.super__Deque_impl_data._M_finish;
        piVar1->_M_cur = piVar1->_M_cur + 1;
      }
    }
    std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string&>
              ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                ->file_buff,&this->line);
    sVar2 = this->line_num;
    this->line_num = sVar2 + 1;
    this->last_line_num = sVar2;
    std::deque<char,_std::allocator<char>_>::clear((deque<char,_std::allocator<char>_> *)local_240);
    (this->line)._M_string_length = 0;
    *(this->line)._M_dataplus._M_p = '\0';
    this->empty_buff = true;
    this->empty_line = true;
  }
  return;
}

Assistant:

void process_endline(const context_t &context, compiler_type &compiler, std::deque<token_base *> &tokens,
		                     charset &encoding)
		{
			if (is_annotation) {
				is_annotation = false;
				new_empty_line(context);
				return;
			}
			if (is_command) {
				is_command = false;
				if (command == "begin" && !multi_line)
					multi_line = true;
				else if (command == "end" && multi_line) {
					tokens.push_back(new token_endline(last_line_num));
					multi_line = false;
				}
				else {
					auto pos = command.find(':');
					std::string arg;
					if (pos != std::string::npos) {
						arg = command.substr(pos + 1);
						command = command.substr(0, pos);
					}
					if (command == "charset") {
						if (arg == "ascii")
							encoding = charset::ascii;
						else if (arg == "utf8")
							encoding = charset::utf8;
						else if (arg == "gbk")
							encoding = charset::gbk;
						else
							throw exception(line_num, context->file_path, "@" + command + ": " + arg,
							                "Unavailable encoding.");
					}
					else if (command == "require") {
						std::string version_str = CS_GET_VERSION_STR(COVSCRIPT_STD_VERSION);
						if (arg > version_str)
							throw exception(line_num, context->file_path, "@" + command + ": " + arg,
							                "Newer Language Standard required: " + arg + ", now on " + version_str);
					}
					else
						throw exception(line_num, context->file_path, "@" + command + (arg.empty() ? "" : ": " + arg),
						                "Wrong grammar for preprocessor command.");
				}
				command.clear();
			}
			if (empty_buff) {
				new_empty_line(context);
				return;
			}
			try {
				compiler.process_char_buff(buff, tokens, encoding);
			}
			catch (const cs::exception &e) {
				throw e;
			}
			catch (const std::exception &e) {
				throw exception(line_num, context->file_path, line, e.what());
			}
			for (auto it = tokens.rbegin(); it != tokens.rend(); ++it) {
				if (*it != nullptr) {
					token_base *ptr = *it;
					if (ptr->get_type() == token_types::endline)
						break;
					else
						ptr->line_num = line_num;
				}
			}
			if (!multi_line)
				tokens.push_back(new token_endline(line_num));
			context->file_buff.emplace_back(line);
			last_line_num = line_num++;
			buff.clear();
			line.clear();
			empty_buff = true;
			empty_line = true;
		}